

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall
QDateTimeEdit::QDateTimeEdit(QDateTimeEdit *this,QVariant *var,Type parserType,QWidget *parent)

{
  long lVar1;
  QTimeZone *this_00;
  QDateTimeEditPrivate *this_01;
  QAbstractSpinBox *in_RCX;
  undefined4 in_EDX;
  EVP_PKEY_CTX *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  Initialization in_stack_ffffffffffffffac;
  QAbstractSpinBoxPrivate *in_stack_ffffffffffffffc8;
  QWidget *zone;
  Data in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  zone = in_RDI;
  this_00 = (QTimeZone *)operator_new(0x510);
  QTimeZone::QTimeZone(this_00,in_stack_ffffffffffffffac);
  QDateTimeEditPrivate::QDateTimeEditPrivate
            ((QDateTimeEditPrivate *)in_stack_fffffffffffffff0.d,(QTimeZone *)zone);
  QAbstractSpinBox::QAbstractSpinBox(in_RCX,in_stack_ffffffffffffffc8,in_RDI);
  QTimeZone::~QTimeZone((QTimeZone *)&stack0xfffffffffffffff0);
  *(undefined ***)in_RDI = &PTR_metaObject_00d11c88;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QDateTimeEdit_00d11e78;
  this_01 = d_func((QDateTimeEdit *)0x557f40);
  *(undefined4 *)&this_01->field_0x458 = in_EDX;
  QDateTimeEditPrivate::init(this_01,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimeEdit::QDateTimeEdit(const QVariant &var, QMetaType::Type parserType, QWidget *parent)
    : QAbstractSpinBox(*new QDateTimeEditPrivate(parserType == QMetaType::QDateTime
                                                 ? QTimeZone::LocalTime : QTimeZone::UTC),
                       parent)
{
    Q_D(QDateTimeEdit);
    d->parserType = parserType;
    d->init(var);
}